

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryManager.cpp
# Opt level: O0

bool __thiscall
MemoryManager::setLong(MemoryManager *this,uint32_t addr,uint64_t val,uint32_t *cycles)

{
  bool bVar1;
  MemoryManager *in_RCX;
  undefined8 in_RDX;
  uint in_ESI;
  undefined8 in_RDI;
  undefined4 in_stack_ffffffffffffffe8;
  
  bVar1 = isAddrExist(in_RCX,(uint32_t)((ulong)in_RDI >> 0x20));
  if (bVar1) {
    setByte((MemoryManager *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),
            (uint32_t)((ulong)in_RDX >> 0x20),(uint8_t)((ulong)in_RDX >> 0x18),(uint32_t *)in_RCX);
    setByte((MemoryManager *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),
            (uint32_t)((ulong)in_RDX >> 0x20),(uint8_t)((ulong)in_RDX >> 0x18),(uint32_t *)in_RCX);
    setByte((MemoryManager *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),
            (uint32_t)((ulong)in_RDX >> 0x20),(uint8_t)((ulong)in_RDX >> 0x18),(uint32_t *)in_RCX);
    setByte((MemoryManager *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),
            (uint32_t)((ulong)in_RDX >> 0x20),(uint8_t)((ulong)in_RDX >> 0x18),(uint32_t *)in_RCX);
    setByte((MemoryManager *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),
            (uint32_t)((ulong)in_RDX >> 0x20),(uint8_t)((ulong)in_RDX >> 0x18),(uint32_t *)in_RCX);
    setByte((MemoryManager *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),
            (uint32_t)((ulong)in_RDX >> 0x20),(uint8_t)((ulong)in_RDX >> 0x18),(uint32_t *)in_RCX);
    setByte((MemoryManager *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),
            (uint32_t)((ulong)in_RDX >> 0x20),(uint8_t)((ulong)in_RDX >> 0x18),(uint32_t *)in_RCX);
    setByte((MemoryManager *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),
            (uint32_t)((ulong)in_RDX >> 0x20),(uint8_t)((ulong)in_RDX >> 0x18),(uint32_t *)in_RCX);
  }
  else {
    dbgprintf("Long write to invalid addr 0x%x!\n",(ulong)in_ESI);
  }
  return bVar1;
}

Assistant:

bool MemoryManager::setLong(uint32_t addr, uint64_t val, uint32_t *cycles) {
  if (!this->isAddrExist(addr)) {
    dbgprintf("Long write to invalid addr 0x%x!\n", addr);
    return false;
  }
  this->setByte(addr, val & 0xFF, cycles);
  this->setByte(addr + 1, (val >> 8) & 0xFF);
  this->setByte(addr + 2, (val >> 16) & 0xFF);
  this->setByte(addr + 3, (val >> 24) & 0xFF);
  this->setByte(addr + 4, (val >> 32) & 0xFF);
  this->setByte(addr + 5, (val >> 40) & 0xFF);
  this->setByte(addr + 6, (val >> 48) & 0xFF);
  this->setByte(addr + 7, (val >> 56) & 0xFF);
  return true;
}